

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *guid;
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  undefined4 uVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  char *local_1a8;
  undefined8 uStack_1a0;
  anon_struct_16_2_6ab6935c fields [22];
  
  fields[0].name = "platform";
  fields[0].element = (_GLFWmapelement *)0x0;
  fields[1].name = "a";
  fields[1].element = mapping->buttons;
  fields[2].name = "b";
  fields[2].element = mapping->buttons + 1;
  fields[3].name = "x";
  fields[3].element = mapping->buttons + 2;
  fields[4].name = "y";
  fields[4].element = mapping->buttons + 3;
  fields[5].name = "back";
  fields[5].element = mapping->buttons + 6;
  fields[6].name = "start";
  fields[6].element = mapping->buttons + 7;
  fields[7].name = "guide";
  fields[7].element = mapping->buttons + 8;
  fields[8].name = "leftshoulder";
  fields[8].element = mapping->buttons + 4;
  fields[9].name = "rightshoulder";
  fields[9].element = mapping->buttons + 5;
  fields[10].name = "leftstick";
  fields[10].element = mapping->buttons + 9;
  fields[0xb].name = "rightstick";
  fields[0xb].element = mapping->buttons + 10;
  fields[0xc].name = "dpup";
  fields[0xc].element = mapping->buttons + 0xb;
  fields[0xd].name = "dpright";
  fields[0xd].element = mapping->buttons + 0xc;
  fields[0xe].name = "dpdown";
  fields[0xe].element = mapping->buttons + 0xd;
  fields[0xf].name = "dpleft";
  fields[0xf].element = mapping->buttons + 0xe;
  fields[0x10].name = "lefttrigger";
  fields[0x12].element = mapping->axes;
  fields[0x10].element = mapping->axes + 4;
  fields[0x11].name = "righttrigger";
  fields[0x11].element = mapping->axes + 5;
  fields[0x12].name = "leftx";
  fields[0x13].name = "lefty";
  fields[0x13].element = mapping->axes + 1;
  fields[0x14].name = "rightx";
  fields[0x14].element = mapping->axes + 2;
  fields[0x15].name = "righty";
  fields[0x15].element = mapping->axes + 3;
  local_1a8 = string;
  sVar8 = strcspn(string,",");
  if ((sVar8 == 0x20) && (string[0x20] == ',')) {
    uVar2 = *(undefined8 *)string;
    uVar3 = *(undefined8 *)(string + 8);
    uVar4 = *(undefined8 *)(string + 0x18);
    *(undefined8 *)(mapping->guid + 0x10) = *(undefined8 *)(string + 0x10);
    *(undefined8 *)(mapping->guid + 0x18) = uVar4;
    *(undefined8 *)mapping->guid = uVar2;
    *(undefined8 *)(mapping->guid + 8) = uVar3;
    pcVar14 = string + 0x21;
    sVar8 = strcspn(pcVar14,",");
    if ((sVar8 < 0x80) && (pcVar14[sVar8] == ',')) {
      guid = mapping->guid;
      memcpy(mapping,pcVar14,sVar8);
      pcVar14 = pcVar14 + sVar8 + 1;
      do {
        cVar5 = *pcVar14;
        local_1a8 = pcVar14;
        if (cVar5 == '\0') {
          for (lVar15 = 0; lVar15 != 0x20; lVar15 = lVar15 + 1) {
            if ((byte)(guid[lVar15] + 0xbfU) < 6) {
              guid[lVar15] = guid[lVar15] | 0x20;
            }
          }
          _glfwPlatformUpdateGamepadGUID(guid);
          return 1;
        }
        if (cVar5 == '+') {
          return 0;
        }
        if (cVar5 == '-') {
          return 0;
        }
        for (lVar15 = 8; lVar15 != 0x168; lVar15 = lVar15 + 0x10) {
          pcVar13 = *(char **)((long)&uStack_1a0 + lVar15);
          sVar8 = strlen(pcVar13);
          iVar7 = strncmp(pcVar14,pcVar13,sVar8);
          if ((iVar7 == 0) && (pcVar14[sVar8] == ':')) {
            pcVar13 = pcVar14 + sVar8 + 1;
            pcVar1 = *(char **)((long)&fields[0].name + lVar15);
            if (pcVar1 == (char *)0x0) {
              local_1a8 = pcVar13;
              iVar7 = strncmp(pcVar13,"Linux",5);
              pcVar14 = pcVar13;
              if (iVar7 != 0) {
                return 0;
              }
              break;
            }
            cVar5 = *pcVar13;
            if (cVar5 == '+') {
              uVar12 = 0;
              cVar11 = '\x01';
LAB_0010dc86:
              pcVar13 = pcVar14 + sVar8 + 2;
              cVar5 = pcVar14[sVar8 + 2];
            }
            else {
              uVar12 = 0xffffffff;
              cVar11 = '\x01';
              if (cVar5 == '-') {
                cVar11 = '\0';
                uVar12 = 0xffffffff;
                goto LAB_0010dc86;
              }
            }
            local_1a8 = pcVar13;
            if (cVar5 == 'a') {
              cVar5 = '\x01';
LAB_0010dcf3:
              *pcVar1 = cVar5;
              uStack_1a0._4_4_ = uVar12;
              uVar10 = strtoul(pcVar13 + 1,&local_1a8,10);
              bVar6 = (byte)uVar10;
            }
            else {
              if (cVar5 != 'h') {
                pcVar14 = pcVar13;
                if (cVar5 == 'b') {
                  cVar5 = '\x02';
                  goto LAB_0010dcf3;
                }
                break;
              }
              *pcVar1 = '\x03';
              uStack_1a0._4_4_ = uVar12;
              uVar10 = strtoul(pcVar13 + 1,&local_1a8,10);
              uVar9 = strtoul(local_1a8 + 1,&local_1a8,10);
              bVar6 = (byte)(uVar10 << 4) | (byte)uVar9;
            }
            pcVar1[1] = bVar6;
            pcVar14 = local_1a8;
            if (*pcVar1 == '\x01') {
              bVar6 = 2 / (byte)(cVar11 - (char)uStack_1a0._4_4_);
              pcVar1[2] = bVar6;
              cVar11 = cVar11 + (char)uStack_1a0._4_4_;
              pcVar1[3] = -cVar11;
              if (*local_1a8 == '~') {
                pcVar1[2] = -bVar6;
                pcVar1[3] = cVar11;
              }
            }
            break;
          }
        }
        sVar8 = strcspn(pcVar14,",");
        pcVar14 = pcVar14 + sVar8;
        local_1a8 = pcVar14;
        sVar8 = strspn(pcVar14,",");
        pcVar14 = pcVar14 + sVar8;
      } while( true );
    }
  }
  _glfwInputError(0x10004,(char *)0x0);
  return 0;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                length = strlen(_GLFW_PLATFORM_MAPPING_NAME);
                if (strncmp(c, _GLFW_PLATFORM_MAPPING_NAME, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfwPlatformUpdateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}